

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifier.c
# Opt level: O0

int flatcc_verify_union_vector_field
              (flatcc_table_verifier_descriptor_t *td,flatbuffers_voffset_t id,int required,
              flatcc_union_verifier_f *uvf)

{
  void *buf_00;
  int iVar1;
  flatbuffers_uoffset_t fVar2;
  flatbuffers_uoffset_t offset;
  flatbuffers_utype_t *p;
  int ret;
  int c;
  flatbuffers_uoffset_t base;
  flatbuffers_uoffset_t count;
  flatbuffers_utype_t *types;
  flatbuffers_uoffset_t *buf;
  flatbuffers_voffset_t vte_table;
  flatcc_union_verifier_f *pfStack_28;
  flatbuffers_voffset_t vte_type;
  flatcc_union_verifier_f *uvf_local;
  int required_local;
  flatbuffers_voffset_t id_local;
  flatcc_table_verifier_descriptor_t *td_local;
  
  pfStack_28 = uvf;
  uvf_local._0_4_ = required;
  uvf_local._6_2_ = id;
  _required_local = td;
  buf._6_2_ = read_vt_entry(td,id - 1);
  if (((buf._6_2_ == 0) &&
      (buf._4_2_ = read_vt_entry(_required_local,uvf_local._6_2_), buf._4_2_ == 0)) &&
     ((int)uvf_local != 0)) {
    td_local._4_4_ = 0x16;
  }
  else {
    iVar1 = flatcc_verify_vector_field
                      (_required_local,uvf_local._6_2_ - 1,(int)uvf_local,1,1,0xffffffff);
    if (iVar1 == 0) {
      p = (flatbuffers_utype_t *)get_field_ptr(_required_local,uvf_local._6_2_ - 1);
      if (p == (flatbuffers_utype_t *)0x0) {
        td_local._4_4_ = 0;
      }
      else {
        types = p;
        fVar2 = read_uoffset(p,0);
        types = p + fVar2;
        c = read_uoffset(types,0);
        _base = types + 4;
        types = _base;
        td_local._4_4_ =
             get_offset_field(_required_local,uvf_local._6_2_,(int)uvf_local,
                              (flatbuffers_uoffset_t *)&ret);
        if ((td_local._4_4_ == 0) && (ret != 0)) {
          buf_00 = _required_local->buf;
          fVar2 = _required_local->end;
          offset = read_uoffset(_required_local->buf,ret);
          td_local._4_4_ =
               verify_union_vector(buf_00,fVar2,ret,offset,c,_base,_required_local->ttl,pfStack_28);
        }
      }
    }
    else {
      td_local._4_4_ =
           flatcc_verify_vector_field
                     (_required_local,uvf_local._6_2_ - 1,(int)uvf_local,1,1,0xffffffff);
    }
  }
  return td_local._4_4_;
}

Assistant:

int flatcc_verify_union_vector_field(flatcc_table_verifier_descriptor_t *td,
    flatbuffers_voffset_t id, int required, flatcc_union_verifier_f uvf)
{
    voffset_t vte_type, vte_table;
    const uoffset_t *buf;
    const utype_t *types;
    uoffset_t count, base;

    if (0 == (vte_type = read_vt_entry(td, id - 1))) {
        if (0 == (vte_table = read_vt_entry(td, id))) {
            verify(!required, flatcc_verify_error_type_field_absent_from_required_union_vector_field);
        }
    }
    check_result(flatcc_verify_vector_field(td, id - 1, required,
                utype_size, utype_size, FLATBUFFERS_COUNT_MAX(utype_size)));
    if (0 == (buf = get_field_ptr(td, id - 1))) {
        return flatcc_verify_ok;
    }
    buf = (const uoffset_t *)((size_t)buf + read_uoffset(buf, 0));
    count = read_uoffset(buf, 0);
    ++buf;
    types = (utype_t *)buf;

    check_field(td, id, required, base);
    return verify_union_vector(td->buf, td->end, base, read_uoffset(td->buf, base),
            count, types, td->ttl, uvf);
}